

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O3

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader2>::SolverApp(SolverApp<TestSolver,_TestNLReader2> *this)

{
  TestSolver *this_00;
  
  this->result_code_ = 0;
  this->banner_size = 0;
  this_00 = &this->solver_;
  TestSolver::TestSolver(this_00,(CStringRef)0x2150ec,(CStringRef)0x0,0,0);
  (this->nl_filename)._M_dataplus._M_p = (pointer)&(this->nl_filename).field_2;
  (this->nl_filename)._M_string_length = 0;
  (this->nl_filename).field_2._M_local_buf[0] = '\0';
  (this->filename_no_ext)._M_dataplus._M_p = (pointer)&(this->filename_no_ext).field_2;
  (this->filename_no_ext)._M_string_length = 0;
  (this->filename_no_ext).field_2._M_local_buf[0] = '\0';
  (this->builder_)._M_t.
  super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>.
  _M_t.
  super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
  .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl =
       (StrictMockProblemBuilder *)0x0;
  (this->handler_)._M_t.
  super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
  .
  super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
  ._M_head_impl =
       (SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
        *)0x0;
  internal::SignalHandler::SignalHandler(&this->sig_handler,(BasicSolver *)this_00);
  internal::SolverAppOptionParser::SolverAppOptionParser
            (&this->option_parser_,(BasicSolver *)this_00);
  (this->output_handler_).super_OutputHandler.has_output = false;
  (this->output_handler_).super_OutputHandler.banner_size = 0;
  (this->callbacks_).init = (_func_void_ptr *)0x0;
  (this->callbacks_).check = (Checker_AMPLS_ModeltTraits)0x0;
  (this->callbacks_).additionalText = (_func_char_ptr *)0x0;
  (this->callbacks_).diagnostics = (_func_void *)0x0;
  (this->output_handler_).super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__OutputHandler_002910b8;
  (this->output_handler_).has_output = false;
  (this->solver_).super_Solver.super_BasicSolver.output_handler_ =
       &(this->output_handler_).super_OutputHandler;
  return;
}

Assistant:

SolverApp() :
    sig_handler(solver_),
    option_parser_(solver_) {
    solver_.set_output_handler(&output_handler_);
  }